

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNewFixed
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          ArrayNewFixed *curr)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  ulong uVar1;
  size_t sVar2;
  Expression **ppEVar3;
  Literal *pLVar4;
  pointer pLVar5;
  long lVar6;
  ExpressionList *__range3;
  pointer initialSize;
  Literal local_f0;
  uintptr_t local_d8;
  HeapType heapType;
  Literal local_c0;
  Literal local_a8;
  undefined1 local_90 [8];
  Literals data;
  
  uVar1 = *(ulong *)(curr + 0x18);
  if (0x2aaaaa9 < (uint)uVar1) {
    (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
  }
  this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(curr + 0x10);
  if (*(long *)(curr + 8) == 1) {
    data.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    sVar2 = *(size_t *)(curr + 0x18);
    local_90 = (undefined1  [8])this_00;
    while( true ) {
      if ((data.super_SmallVector<wasm::Literal,_1UL>.usedFixed == sVar2) &&
         (local_90 == (undefined1  [8])this_00)) {
        wasm::handle_unreachable
                  ("unreachable but no unreachable child",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0x778);
      }
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_90);
      visit(__return_storage_ptr__,this,*ppEVar3);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) break;
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
      data.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           data.super_SmallVector<wasm::Literal,_1UL>.usedFixed + 1;
    }
  }
  else {
    initialSize = (pointer)(uVar1 & 0xffffffff);
    local_d8 = (uintptr_t)Type::getHeapType((Type *)(curr + 8));
    wasm::HeapType::getArray();
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)local_90,(size_t)initialSize);
    lVar6 = -0x18;
    for (pLVar5 = (pointer)0x0; initialSize != pLVar5;
        pLVar5 = (pointer)((long)&(pLVar5->field_0).func.super_IString.str._M_len + 1)) {
      data.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pLVar5;
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (this_00,(size_t)pLVar5);
      visit(__return_storage_ptr__,this,*ppEVar3);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
      goto LAB_001423b6;
      pLVar4 = Flow::getSingleValue(__return_storage_ptr__);
      wasm::Literal::Literal(&local_c0,pLVar4);
      truncateForPacking(&local_f0,this,&local_c0,(Field *)&heapType);
      pLVar5 = data.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pLVar4 = (Literal *)
               (data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id + lVar6);
      if (data.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        pLVar4 = (Literal *)&data;
      }
      wasm::Literal::operator=(pLVar4,&local_f0);
      wasm::Literal::~Literal(&local_f0);
      wasm::Literal::~Literal(&local_c0);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
      lVar6 = lVar6 + 0x18;
    }
    makeGCData(&local_a8,this,(Literals *)local_90,(Type)*(uintptr_t *)(curr + 8));
    Flow::Flow(__return_storage_ptr__,&local_a8);
    wasm::Literal::~Literal(&local_a8);
LAB_001423b6:
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNewFixed(ArrayNewFixed* curr) {
    NOTE_ENTER("ArrayNewFixed");
    Index num = curr->values.size();
    if (num >= DataLimit) {
      hostLimit("allocation failure");
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* value : curr->values) {
        auto result = self()->visit(value);
        if (result.breaking()) {
          return result;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    auto field = heapType.getArray().element;
    Literals data(num);
    for (Index i = 0; i < num; i++) {
      auto value = self()->visit(curr->values[i]);
      if (value.breaking()) {
        return value;
      }
      data[i] = truncateForPacking(value.getSingleValue(), field);
    }
    return makeGCData(std::move(data), curr->type);
  }